

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O1

int hwpq_vdpp_check_work_mode(rk_vdpp_context ctx,rk_vdpp_proc_params *p_proc_param)

{
  vdpp_com_ctx *vdpp;
  _func_RK_S32_VdppCtx *p_Var1;
  MPP_RET MVar2;
  uint uVar3;
  char *fname;
  char *fmt;
  ulong uVar4;
  
  if (ctx == (rk_vdpp_context)0x0 || p_proc_param == (rk_vdpp_proc_params *)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL vdpp %p proc_param %p","hwpq_vdpp_check_work_mode");
  }
  else {
    vdpp = *ctx;
    if ((vdpp == (vdpp_com_ctx *)0x0) || (vdpp->ops == (vdpp_com_ops *)0x0)) {
      fmt = "found NULL vdpp or ops";
      fname = "hwpq_vdpp_check_work_mode";
    }
    else {
      MVar2 = hwpq_vdpp_common_config(vdpp,p_proc_param);
      if (MVar2 == MPP_OK) {
        p_Var1 = vdpp->ops->check_cap;
        if (p_Var1 == (_func_RK_S32_VdppCtx *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar3 = (*p_Var1)(vdpp->priv);
          uVar4 = (ulong)uVar3;
        }
        if (((byte)hwpq_vdpp_debug & 2) != 0) {
          _mpp_log_l(4,(char *)0x0,"vdpp cap_mode %d",(char *)0x0,uVar4);
        }
        if ((uVar4 & 1) != 0) {
          return 0;
        }
        return -(uint)((uVar4 & 2) == 0) | 1;
      }
      fmt = "vdpp common config failed\n";
      fname = (char *)0x0;
    }
    _mpp_log_l(2,(char *)0x0,fmt,fname);
  }
  return -1;
}

Assistant:

int hwpq_vdpp_check_work_mode(rk_vdpp_context ctx, rk_vdpp_proc_params *p_proc_param)
{
    RK_S32 cap_mode = VDPP_CAP_UNSUPPORTED;
    VdppCtxImpl *p = (VdppCtxImpl*)ctx;
    vdpp_com_ctx* vdpp = NULL;
    int run_mode = VDPP_RUN_MODE_UNSUPPORTED;
    MPP_RET ret = MPP_NOK;

    if (NULL == ctx || NULL == p_proc_param) {
        mpp_err_f("found NULL vdpp %p proc_param %p", ctx, p_proc_param);
        return VDPP_RUN_MODE_UNSUPPORTED;
    }

    vdpp = p->vdpp;
    if (NULL == vdpp || NULL == vdpp->ops) {
        mpp_err_f("found NULL vdpp or ops");
        return VDPP_RUN_MODE_UNSUPPORTED;
    }

    ret = hwpq_vdpp_common_config(vdpp, p_proc_param);
    if (ret) {
        mpp_err("vdpp common config failed\n");
        return VDPP_RUN_MODE_UNSUPPORTED;
    }

    if (vdpp->ops->check_cap)
        cap_mode = vdpp->ops->check_cap(vdpp->priv);

    hwpq_vdpp_info("vdpp cap_mode %d", cap_mode);
    /* vep first */
    if (VDPP_CAP_VEP & cap_mode)
        run_mode = VDPP_RUN_MODE_VEP;
    else if (VDPP_CAP_HIST & cap_mode)
        run_mode = VDPP_RUN_MODE_HIST;

    return run_mode;
}